

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O1

boolean spell_would_be_useless(monst *mtmp,uint adtyp,int spellnum)

{
  uint uVar1;
  
  if (adtyp == 0xf0) {
    if ((spellnum != 5) || ((*(uint *)&mtmp->field_0x60 & 0x400000) == 0)) {
      if ((spellnum != 1 || mtmp->mhp != mtmp->mhpmax) &&
         (spellnum != 5 || (viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) {
        if (spellnum != 4) {
          return '\0';
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          return '\0';
        }
      }
    }
  }
  else {
    if (adtyp != 0xf1) {
      return '\0';
    }
    uVar1 = *(uint *)&mtmp->field_0x60;
    if (((spellnum - 8U < 3 & (byte)(uVar1 >> 0x16) & 1) == 0) &&
       (spellnum != 2 || (uVar1 & 0x3000) != 0x2000)) {
      if ((uVar1 & 2) == 0) {
        if ((spellnum == 4 & (byte)((uVar1 & 4) >> 2)) != 0) {
          return '\x01';
        }
      }
      else if (spellnum == 4) {
        return '\x01';
      }
      if (((((((uVar1 >> 0x16 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) ||
           ((spellnum != 4 || (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
          ((spellnum != 1 || (mtmp->mhp != mtmp->mhpmax)))) &&
         (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 ||
          ((spellnum != 9 && (spellnum != 10 || (uVar1 & 0x20000000) != 0)))))) {
        if (spellnum != 10) {
          return '\0';
        }
        if ((uVar1 >> 0x1d & 1) != 0 && flags.no_of_wizards < 2) {
          return '\0';
        }
      }
    }
  }
  return '\x01';
}

Assistant:

static boolean spell_would_be_useless(struct monst *mtmp, unsigned int adtyp,
				      int spellnum)
{
    /* Some spells don't require the player to really be there and can be cast
     * by the monster when you're invisible, yet still shouldn't be cast when
     * the monster doesn't even think you're there.
     * This check isn't quite right because it always uses your real position.
     * We really want something like "if the monster could see mux, muy".
     */
    boolean mcouldseeu = couldsee(mtmp->mx, mtmp->my);

    if (adtyp == AD_SPEL) {
	/* aggravate monsters, etc. won't be cast by peaceful monsters */
	if (mtmp->mpeaceful && (spellnum == MGC_AGGRAVATION ||
		spellnum == MGC_SUMMON_MONS || spellnum == MGC_CLONE_WIZ))
	    return TRUE;
	/* haste self when already fast */
	if (mtmp->permspeed == MFAST && spellnum == MGC_HASTE_SELF)
	    return TRUE;
	/* invisibility when already invisible */
	if ((mtmp->minvis || mtmp->invis_blkd) && spellnum == MGC_DISAPPEAR)
	    return TRUE;
	/* peaceful monster won't cast invisibility if you can't see invisible,
	   same as when monsters drink potions of invisibility.  This doesn't
	   really make a lot of sense, but lets the player avoid hitting
	   peaceful monsters by mistake */
	if (mtmp->mpeaceful && !See_invisible && spellnum == MGC_DISAPPEAR)
	    return TRUE;
	/* healing when already healed */
	if (mtmp->mhp == mtmp->mhpmax && spellnum == MGC_CURE_SELF)
	    return TRUE;
	/* don't summon monsters if it doesn't think you're around */
	if (!mcouldseeu && (spellnum == MGC_SUMMON_MONS ||
		(!mtmp->iswiz && spellnum == MGC_CLONE_WIZ)))
	    return TRUE;
	if ((!mtmp->iswiz || flags.no_of_wizards > 1)
						&& spellnum == MGC_CLONE_WIZ)
	    return TRUE;
    } else if (adtyp == AD_CLRC) {
	/* summon insects/sticks to snakes won't be cast by peaceful monsters */
	if (mtmp->mpeaceful && spellnum == CLC_INSECTS)
	    return TRUE;
	/* healing when already healed */
	if (mtmp->mhp == mtmp->mhpmax && spellnum == CLC_CURE_SELF)
	    return TRUE;
	/* don't summon insects if it doesn't think you're around */
	if (!mcouldseeu && spellnum == CLC_INSECTS)
	    return TRUE;
	/* blindness spell on blinded player */
	if (Blinded && spellnum == CLC_BLIND_YOU)
	    return TRUE;
    }
    return FALSE;
}